

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Parser.cpp
# Opt level: O0

void __thiscall
Assimp::MD5::MD5MeshParser::MD5MeshParser(MD5MeshParser *this,SectionList *mSections)

{
  BoneDesc *this_00;
  char cVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  Logger *pLVar5;
  reference pSVar6;
  reference this_01;
  reference out;
  reference pvVar7;
  uint *puVar8;
  size_type sVar9;
  reference pvVar10;
  char *pcVar11;
  WeightDesc *weight;
  uint idx_2;
  uint i;
  aiFace *face;
  uint idx_1;
  VertexDesc *vert;
  uint idx;
  char *szEnd_1;
  char *szStart_1;
  char *sz_1;
  Element *elem_1;
  const_iterator __end6;
  const_iterator __begin6;
  ElementList *__range6;
  MeshDesc *desc_1;
  char *local_540;
  char *szEnd;
  char *szStart;
  char *sz;
  BoneDesc *desc;
  reference local_68;
  Element *elem;
  const_iterator __end5;
  const_iterator __begin5;
  ElementList *__range5;
  __normal_iterator<const_Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
  local_40;
  const_iterator iterEnd;
  __normal_iterator<const_Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
  local_30;
  const_iterator iter;
  SectionList *mSections_local;
  MD5MeshParser *this_local;
  
  std::vector<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>::vector(&this->mMeshes)
  ;
  std::vector<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>::vector(&this->mJoints)
  ;
  pLVar5 = DefaultLogger::get();
  Logger::debug(pLVar5,"MD5MeshParser begin");
  iterEnd._M_current =
       (Section *)
       std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>::begin(mSections);
  __gnu_cxx::
  __normal_iterator<Assimp::MD5::Section_const*,std::vector<Assimp::MD5::Section,std::allocator<Assimp::MD5::Section>>>
  ::__normal_iterator<Assimp::MD5::Section*>
            ((__normal_iterator<Assimp::MD5::Section_const*,std::vector<Assimp::MD5::Section,std::allocator<Assimp::MD5::Section>>>
              *)&local_30,
             (__normal_iterator<Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
              *)&iterEnd);
  __range5 = (ElementList *)
             std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>::end
                       (mSections);
  __gnu_cxx::
  __normal_iterator<Assimp::MD5::Section_const*,std::vector<Assimp::MD5::Section,std::allocator<Assimp::MD5::Section>>>
  ::__normal_iterator<Assimp::MD5::Section*>
            ((__normal_iterator<Assimp::MD5::Section_const*,std::vector<Assimp::MD5::Section,std::allocator<Assimp::MD5::Section>>>
              *)&local_40,
             (__normal_iterator<Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
              *)&__range5);
  while (bVar2 = __gnu_cxx::operator!=(&local_30,&local_40), bVar2) {
    pSVar6 = __gnu_cxx::
             __normal_iterator<const_Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
             ::operator*(&local_30);
    bVar2 = std::operator==(&pSVar6->mName,"numMeshes");
    if (bVar2) {
      __gnu_cxx::
      __normal_iterator<const_Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
      ::operator*(&local_30);
      pcVar11 = (char *)std::__cxx11::string::c_str();
      uVar4 = strtoul10(pcVar11,(char **)0x0);
      std::vector<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>::reserve
                (&this->mMeshes,(ulong)uVar4);
    }
    else {
      pSVar6 = __gnu_cxx::
               __normal_iterator<const_Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
               ::operator*(&local_30);
      bVar2 = std::operator==(&pSVar6->mName,"numJoints");
      if (bVar2) {
        __gnu_cxx::
        __normal_iterator<const_Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
        ::operator*(&local_30);
        pcVar11 = (char *)std::__cxx11::string::c_str();
        uVar4 = strtoul10(pcVar11,(char **)0x0);
        std::vector<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>::reserve
                  (&this->mJoints,(ulong)uVar4);
      }
      else {
        pSVar6 = __gnu_cxx::
                 __normal_iterator<const_Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
                 ::operator*(&local_30);
        bVar2 = std::operator==(&pSVar6->mName,"joints");
        if (bVar2) {
          pSVar6 = __gnu_cxx::
                   __normal_iterator<const_Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
                   ::operator*(&local_30);
          __end5 = std::vector<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>::begin
                             (&pSVar6->mElements);
          elem = (Element *)
                 std::vector<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>::end
                           (&pSVar6->mElements);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end5,(__normal_iterator<const_Assimp::MD5::Element_*,_std::vector<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>_>
                                             *)&elem), bVar2) {
            local_68 = __gnu_cxx::
                       __normal_iterator<const_Assimp::MD5::Element_*,_std::vector<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>_>
                       ::operator*(&__end5);
            this_00 = (BoneDesc *)((long)&desc + 4);
            memset(this_00,0,0x4b4);
            BoneDesc::BoneDesc(this_00);
            std::vector<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>::push_back
                      (&this->mJoints,this_00);
            sz = (char *)std::vector<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                         ::back(&this->mJoints);
            for (szStart = local_68->szStart; *szStart != '\"'; szStart = szStart + 1) {
            }
            szEnd = szStart + 1;
            for (szStart = szEnd; *szStart != '\"'; szStart = szStart + 1) {
            }
            local_540 = szStart;
            pcVar11 = local_540;
            local_540._0_4_ = (int)szStart;
            (((reference)sz)->super_BaseJointDescription).mName.length = (int)local_540 - (int)szEnd
            ;
            local_540 = pcVar11;
            szStart = szStart + 1;
            memcpy((((reference)sz)->super_BaseJointDescription).mName.data,szEnd,
                   (ulong)(((reference)sz)->super_BaseJointDescription).mName.length);
            sz[(ulong)*(uint *)sz + 4] = '\0';
            bVar2 = SkipSpaces<char>(&szStart);
            if (!bVar2) {
              MD5Parser::ReportWarning("Unexpected end of line",local_68->iLineNumber);
            }
            iVar3 = strtol10(szStart,&szStart);
            *(int *)(sz + 0x404) = iVar3;
            bVar2 = SkipSpaces<char>(&szStart);
            if (!bVar2) {
              MD5Parser::ReportWarning("Unexpected end of line",local_68->iLineNumber);
            }
            pcVar11 = szStart + 1;
            cVar1 = *szStart;
            szStart = pcVar11;
            if (cVar1 != '(') {
              MD5Parser::ReportWarning("Unexpected token: ( was expected",local_68->iLineNumber);
            }
            bVar2 = SkipSpaces<char>(&szStart);
            if (!bVar2) {
              MD5Parser::ReportWarning("Unexpected end of line",local_68->iLineNumber);
            }
            szStart = fast_atoreal_move<float>(szStart,(float *)(sz + 0x408),true);
            bVar2 = SkipSpaces<char>(&szStart);
            if (!bVar2) {
              MD5Parser::ReportWarning("Unexpected end of line",local_68->iLineNumber);
            }
            szStart = fast_atoreal_move<float>(szStart,(float *)(sz + 0x40c),true);
            bVar2 = SkipSpaces<char>(&szStart);
            if (!bVar2) {
              MD5Parser::ReportWarning("Unexpected end of line",local_68->iLineNumber);
            }
            szStart = fast_atoreal_move<float>(szStart,(float *)(sz + 0x410),true);
            bVar2 = SkipSpaces<char>(&szStart);
            if (!bVar2) {
              MD5Parser::ReportWarning("Unexpected end of line",local_68->iLineNumber);
            }
            pcVar11 = szStart + 1;
            cVar1 = *szStart;
            szStart = pcVar11;
            if (cVar1 != ')') {
              MD5Parser::ReportWarning("Unexpected token: ) was expected",local_68->iLineNumber);
            }
            bVar2 = SkipSpaces<char>(&szStart);
            if (!bVar2) {
              MD5Parser::ReportWarning("Unexpected end of line",local_68->iLineNumber);
            }
            pcVar11 = szStart + 1;
            cVar1 = *szStart;
            szStart = pcVar11;
            if (cVar1 != '(') {
              MD5Parser::ReportWarning("Unexpected token: ( was expected",local_68->iLineNumber);
            }
            bVar2 = SkipSpaces<char>(&szStart);
            if (!bVar2) {
              MD5Parser::ReportWarning("Unexpected end of line",local_68->iLineNumber);
            }
            szStart = fast_atoreal_move<float>(szStart,(float *)(sz + 0x414),true);
            bVar2 = SkipSpaces<char>(&szStart);
            if (!bVar2) {
              MD5Parser::ReportWarning("Unexpected end of line",local_68->iLineNumber);
            }
            szStart = fast_atoreal_move<float>(szStart,(float *)(sz + 0x418),true);
            bVar2 = SkipSpaces<char>(&szStart);
            if (!bVar2) {
              MD5Parser::ReportWarning("Unexpected end of line",local_68->iLineNumber);
            }
            szStart = fast_atoreal_move<float>(szStart,(float *)(sz + 0x41c),true);
            bVar2 = SkipSpaces<char>(&szStart);
            if (!bVar2) {
              MD5Parser::ReportWarning("Unexpected end of line",local_68->iLineNumber);
            }
            pcVar11 = szStart + 1;
            cVar1 = *szStart;
            szStart = pcVar11;
            if (cVar1 != ')') {
              MD5Parser::ReportWarning("Unexpected token: ) was expected",local_68->iLineNumber);
            }
            __gnu_cxx::
            __normal_iterator<const_Assimp::MD5::Element_*,_std::vector<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>_>
            ::operator++(&__end5);
          }
        }
        else {
          pSVar6 = __gnu_cxx::
                   __normal_iterator<const_Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
                   ::operator*(&local_30);
          bVar2 = std::operator==(&pSVar6->mName,"mesh");
          if (bVar2) {
            memset((MeshDesc *)&desc_1,0,0x450);
            MeshDesc::MeshDesc((MeshDesc *)&desc_1);
            std::vector<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>::push_back
                      (&this->mMeshes,(MeshDesc *)&desc_1);
            MeshDesc::~MeshDesc((MeshDesc *)&desc_1);
            this_01 = std::vector<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>::
                      back(&this->mMeshes);
            pSVar6 = __gnu_cxx::
                     __normal_iterator<const_Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
                     ::operator*(&local_30);
            __end6 = std::vector<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>::begin
                               (&pSVar6->mElements);
            elem_1 = (Element *)
                     std::vector<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>::end
                               (&pSVar6->mElements);
            while (bVar2 = __gnu_cxx::operator!=
                                     (&__end6,(__normal_iterator<const_Assimp::MD5::Element_*,_std::vector<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>_>
                                               *)&elem_1), bVar2) {
              sz_1 = (char *)__gnu_cxx::
                             __normal_iterator<const_Assimp::MD5::Element_*,_std::vector<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>_>
                             ::operator*(&__end6);
              szStart_1 = ((reference)sz_1)->szStart;
              bVar2 = TokenMatch<char_const>(&szStart_1,"shader",6);
              if (bVar2) {
                bVar2 = SkipSpaces<char>(&szStart_1);
                if (!bVar2) {
                  MD5Parser::ReportWarning("Unexpected end of line",*(uint *)(sz_1 + 8));
                }
                for (; *szStart_1 != '\"'; szStart_1 = szStart_1 + 1) {
                }
                pcVar11 = szStart_1 + 1;
                for (szStart_1 = pcVar11; *szStart_1 != '\"'; szStart_1 = szStart_1 + 1) {
                }
                (this_01->mShader).length = (int)szStart_1 - (int)pcVar11;
                szStart_1 = szStart_1 + 1;
                memcpy((this_01->mShader).data,pcVar11,(ulong)(this_01->mShader).length);
                (this_01->mShader).data[(this_01->mShader).length] = '\0';
              }
              else {
                bVar2 = TokenMatch<char_const>(&szStart_1,"numverts",8);
                if (bVar2) {
                  bVar2 = SkipSpaces<char>(&szStart_1);
                  if (!bVar2) {
                    MD5Parser::ReportWarning("Unexpected end of line",*(uint *)(sz_1 + 8));
                  }
                  uVar4 = strtoul10(szStart_1,(char **)0x0);
                  std::vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>::
                  resize(&this_01->mVertices,(ulong)uVar4);
                }
                else {
                  bVar2 = TokenMatch<char_const>(&szStart_1,"numtris",7);
                  if (bVar2) {
                    bVar2 = SkipSpaces<char>(&szStart_1);
                    if (!bVar2) {
                      MD5Parser::ReportWarning("Unexpected end of line",*(uint *)(sz_1 + 8));
                    }
                    uVar4 = strtoul10(szStart_1,(char **)0x0);
                    std::vector<aiFace,_std::allocator<aiFace>_>::resize
                              (&this_01->mFaces,(ulong)uVar4);
                  }
                  else {
                    bVar2 = TokenMatch<char_const>(&szStart_1,"numweights",10);
                    if (bVar2) {
                      bVar2 = SkipSpaces<char>(&szStart_1);
                      if (!bVar2) {
                        MD5Parser::ReportWarning("Unexpected end of line",*(uint *)(sz_1 + 8));
                      }
                      uVar4 = strtoul10(szStart_1,(char **)0x0);
                      std::vector<Assimp::MD5::WeightDesc,_std::allocator<Assimp::MD5::WeightDesc>_>
                      ::resize(&this_01->mWeights,(ulong)uVar4);
                    }
                    else {
                      bVar2 = TokenMatch<char_const>(&szStart_1,"vert",4);
                      if (bVar2) {
                        bVar2 = SkipSpaces<char>(&szStart_1);
                        if (!bVar2) {
                          MD5Parser::ReportWarning("Unexpected end of line",*(uint *)(sz_1 + 8));
                        }
                        uVar4 = strtoul10(szStart_1,&szStart_1);
                        bVar2 = SkipSpaces<char>(&szStart_1);
                        if (!bVar2) {
                          MD5Parser::ReportWarning("Unexpected end of line",*(uint *)(sz_1 + 8));
                        }
                        sVar9 = std::
                                vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                                ::size(&this_01->mVertices);
                        if (sVar9 <= uVar4) {
                          std::
                          vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                          ::resize(&this_01->mVertices,(ulong)(uVar4 + 1));
                        }
                        out = std::
                              vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                              ::operator[](&this_01->mVertices,(ulong)uVar4);
                        pcVar11 = szStart_1 + 1;
                        cVar1 = *szStart_1;
                        szStart_1 = pcVar11;
                        if (cVar1 != '(') {
                          MD5Parser::ReportWarning
                                    ("Unexpected token: ( was expected",*(uint *)(sz_1 + 8));
                        }
                        bVar2 = SkipSpaces<char>(&szStart_1);
                        if (!bVar2) {
                          MD5Parser::ReportWarning("Unexpected end of line",*(uint *)(sz_1 + 8));
                        }
                        szStart_1 = fast_atoreal_move<float>(szStart_1,(float *)out,true);
                        bVar2 = SkipSpaces<char>(&szStart_1);
                        if (!bVar2) {
                          MD5Parser::ReportWarning("Unexpected end of line",*(uint *)(sz_1 + 8));
                        }
                        szStart_1 = fast_atoreal_move<float>(szStart_1,&(out->mUV).y,true);
                        bVar2 = SkipSpaces<char>(&szStart_1);
                        if (!bVar2) {
                          MD5Parser::ReportWarning("Unexpected end of line",*(uint *)(sz_1 + 8));
                        }
                        pcVar11 = szStart_1 + 1;
                        cVar1 = *szStart_1;
                        szStart_1 = pcVar11;
                        if (cVar1 != ')') {
                          MD5Parser::ReportWarning
                                    ("Unexpected token: ) was expected",*(uint *)(sz_1 + 8));
                        }
                        bVar2 = SkipSpaces<char>(&szStart_1);
                        if (!bVar2) {
                          MD5Parser::ReportWarning("Unexpected end of line",*(uint *)(sz_1 + 8));
                        }
                        uVar4 = strtoul10(szStart_1,&szStart_1);
                        out->mFirstWeight = uVar4;
                        bVar2 = SkipSpaces<char>(&szStart_1);
                        if (!bVar2) {
                          MD5Parser::ReportWarning("Unexpected end of line",*(uint *)(sz_1 + 8));
                        }
                        uVar4 = strtoul10(szStart_1,&szStart_1);
                        out->mNumWeights = uVar4;
                      }
                      else {
                        bVar2 = TokenMatch<char_const>(&szStart_1,"tri",3);
                        if (bVar2) {
                          bVar2 = SkipSpaces<char>(&szStart_1);
                          if (!bVar2) {
                            MD5Parser::ReportWarning("Unexpected end of line",*(uint *)(sz_1 + 8));
                          }
                          uVar4 = strtoul10(szStart_1,&szStart_1);
                          sVar9 = std::vector<aiFace,_std::allocator<aiFace>_>::size
                                            (&this_01->mFaces);
                          if (sVar9 <= uVar4) {
                            std::vector<aiFace,_std::allocator<aiFace>_>::resize
                                      (&this_01->mFaces,(ulong)(uVar4 + 1));
                          }
                          pvVar7 = std::vector<aiFace,_std::allocator<aiFace>_>::operator[]
                                             (&this_01->mFaces,(ulong)uVar4);
                          pvVar7->mNumIndices = 3;
                          puVar8 = (uint *)operator_new__(0xc);
                          pvVar7->mIndices = puVar8;
                          for (weight._4_4_ = 0; weight._4_4_ < 3; weight._4_4_ = weight._4_4_ + 1)
                          {
                            bVar2 = SkipSpaces<char>(&szStart_1);
                            if (!bVar2) {
                              MD5Parser::ReportWarning("Unexpected end of line",*(uint *)(sz_1 + 8))
                              ;
                            }
                            uVar4 = strtoul10(szStart_1,&szStart_1);
                            pvVar7->mIndices[weight._4_4_] = uVar4;
                          }
                        }
                        else {
                          bVar2 = TokenMatch<char_const>(&szStart_1,"weight",6);
                          if (bVar2) {
                            bVar2 = SkipSpaces<char>(&szStart_1);
                            if (!bVar2) {
                              MD5Parser::ReportWarning("Unexpected end of line",*(uint *)(sz_1 + 8))
                              ;
                            }
                            uVar4 = strtoul10(szStart_1,&szStart_1);
                            bVar2 = SkipSpaces<char>(&szStart_1);
                            if (!bVar2) {
                              MD5Parser::ReportWarning("Unexpected end of line",*(uint *)(sz_1 + 8))
                              ;
                            }
                            sVar9 = std::
                                    vector<Assimp::MD5::WeightDesc,_std::allocator<Assimp::MD5::WeightDesc>_>
                                    ::size(&this_01->mWeights);
                            if (sVar9 <= uVar4) {
                              std::
                              vector<Assimp::MD5::WeightDesc,_std::allocator<Assimp::MD5::WeightDesc>_>
                              ::resize(&this_01->mWeights,(ulong)(uVar4 + 1));
                            }
                            pvVar10 = std::
                                      vector<Assimp::MD5::WeightDesc,_std::allocator<Assimp::MD5::WeightDesc>_>
                                      ::operator[](&this_01->mWeights,(ulong)uVar4);
                            uVar4 = strtoul10(szStart_1,&szStart_1);
                            pvVar10->mBone = uVar4;
                            bVar2 = SkipSpaces<char>(&szStart_1);
                            if (!bVar2) {
                              MD5Parser::ReportWarning("Unexpected end of line",*(uint *)(sz_1 + 8))
                              ;
                            }
                            szStart_1 = fast_atoreal_move<float>(szStart_1,&pvVar10->mWeight,true);
                            bVar2 = SkipSpaces<char>(&szStart_1);
                            if (!bVar2) {
                              MD5Parser::ReportWarning("Unexpected end of line",*(uint *)(sz_1 + 8))
                              ;
                            }
                            pcVar11 = szStart_1 + 1;
                            cVar1 = *szStart_1;
                            szStart_1 = pcVar11;
                            if (cVar1 != '(') {
                              MD5Parser::ReportWarning
                                        ("Unexpected token: ( was expected",*(uint *)(sz_1 + 8));
                            }
                            bVar2 = SkipSpaces<char>(&szStart_1);
                            if (!bVar2) {
                              MD5Parser::ReportWarning("Unexpected end of line",*(uint *)(sz_1 + 8))
                              ;
                            }
                            szStart_1 = fast_atoreal_move<float>
                                                  (szStart_1,&(pvVar10->vOffsetPosition).x,true);
                            bVar2 = SkipSpaces<char>(&szStart_1);
                            if (!bVar2) {
                              MD5Parser::ReportWarning("Unexpected end of line",*(uint *)(sz_1 + 8))
                              ;
                            }
                            szStart_1 = fast_atoreal_move<float>
                                                  (szStart_1,&(pvVar10->vOffsetPosition).y,true);
                            bVar2 = SkipSpaces<char>(&szStart_1);
                            if (!bVar2) {
                              MD5Parser::ReportWarning("Unexpected end of line",*(uint *)(sz_1 + 8))
                              ;
                            }
                            szStart_1 = fast_atoreal_move<float>
                                                  (szStart_1,&(pvVar10->vOffsetPosition).z,true);
                            bVar2 = SkipSpaces<char>(&szStart_1);
                            if (!bVar2) {
                              MD5Parser::ReportWarning("Unexpected end of line",*(uint *)(sz_1 + 8))
                              ;
                            }
                            pcVar11 = szStart_1 + 1;
                            cVar1 = *szStart_1;
                            szStart_1 = pcVar11;
                            if (cVar1 != ')') {
                              MD5Parser::ReportWarning
                                        ("Unexpected token: ) was expected",*(uint *)(sz_1 + 8));
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              __gnu_cxx::
              __normal_iterator<const_Assimp::MD5::Element_*,_std::vector<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>_>
              ::operator++(&__end6);
            }
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
    ::operator++(&local_30);
  }
  pLVar5 = DefaultLogger::get();
  Logger::debug(pLVar5,"MD5MeshParser end");
  return;
}

Assistant:

MD5MeshParser::MD5MeshParser(SectionList& mSections)
{
    ASSIMP_LOG_DEBUG("MD5MeshParser begin");

    // now parse all sections
    for (SectionList::const_iterator iter =  mSections.begin(), iterEnd = mSections.end();iter != iterEnd;++iter){
        if ( (*iter).mName == "numMeshes")  {
            mMeshes.reserve(::strtoul10((*iter).mGlobalValue.c_str()));
        }
        else if ( (*iter).mName == "numJoints") {
            mJoints.reserve(::strtoul10((*iter).mGlobalValue.c_str()));
        }
        else if ((*iter).mName == "joints") {
            // "origin" -1 ( -0.000000 0.016430 -0.006044 ) ( 0.707107 0.000000 0.707107 )
            for (const auto & elem : (*iter).mElements){
                mJoints.push_back(BoneDesc());
                BoneDesc& desc = mJoints.back();
				
                const char* sz = elem.szStart;
				AI_MD5_PARSE_STRING_IN_QUOTATION(desc.mName);
                AI_MD5_SKIP_SPACES();

                // negative values, at least -1, is allowed here
                desc.mParentIndex = (int)strtol10(sz,&sz);

                AI_MD5_READ_TRIPLE(desc.mPositionXYZ);
                AI_MD5_READ_TRIPLE(desc.mRotationQuat); // normalized quaternion, so w is not there
            }
        }
        else if ((*iter).mName == "mesh")   {
            mMeshes.push_back(MeshDesc());
            MeshDesc& desc = mMeshes.back();

            for (const auto & elem : (*iter).mElements){
                const char* sz = elem.szStart;

                // shader attribute
                if (TokenMatch(sz,"shader",6))  {
                    AI_MD5_SKIP_SPACES();
                    AI_MD5_PARSE_STRING_IN_QUOTATION(desc.mShader);
                }
                // numverts attribute
                else if (TokenMatch(sz,"numverts",8))   {
                    AI_MD5_SKIP_SPACES();
                    desc.mVertices.resize(strtoul10(sz));
                }
                // numtris attribute
                else if (TokenMatch(sz,"numtris",7))    {
                    AI_MD5_SKIP_SPACES();
                    desc.mFaces.resize(strtoul10(sz));
                }
                // numweights attribute
                else if (TokenMatch(sz,"numweights",10))    {
                    AI_MD5_SKIP_SPACES();
                    desc.mWeights.resize(strtoul10(sz));
                }
                // vert attribute
                // "vert 0 ( 0.394531 0.513672 ) 0 1"
                else if (TokenMatch(sz,"vert",4))   {
                    AI_MD5_SKIP_SPACES();
                    const unsigned int idx = ::strtoul10(sz,&sz);
                    AI_MD5_SKIP_SPACES();
                    if (idx >= desc.mVertices.size())
                        desc.mVertices.resize(idx+1);

                    VertexDesc& vert = desc.mVertices[idx];
                    if ('(' != *sz++)
                        MD5Parser::ReportWarning("Unexpected token: ( was expected",elem.iLineNumber);
                    AI_MD5_SKIP_SPACES();
                    sz = fast_atoreal_move<float>(sz,(float&)vert.mUV.x);
                    AI_MD5_SKIP_SPACES();
                    sz = fast_atoreal_move<float>(sz,(float&)vert.mUV.y);
                    AI_MD5_SKIP_SPACES();
                    if (')' != *sz++)
                        MD5Parser::ReportWarning("Unexpected token: ) was expected",elem.iLineNumber);
                    AI_MD5_SKIP_SPACES();
                    vert.mFirstWeight = ::strtoul10(sz,&sz);
                    AI_MD5_SKIP_SPACES();
                    vert.mNumWeights = ::strtoul10(sz,&sz);
                }
                // tri attribute
                // "tri 0 15 13 12"
                else if (TokenMatch(sz,"tri",3)) {
                    AI_MD5_SKIP_SPACES();
                    const unsigned int idx = strtoul10(sz,&sz);
                    if (idx >= desc.mFaces.size())
                        desc.mFaces.resize(idx+1);

                    aiFace& face = desc.mFaces[idx];
                    face.mIndices = new unsigned int[face.mNumIndices = 3];
                    for (unsigned int i = 0; i < 3;++i) {
                        AI_MD5_SKIP_SPACES();
                        face.mIndices[i] = strtoul10(sz,&sz);
                    }
                }
                // weight attribute
                // "weight 362 5 0.500000 ( -3.553583 11.893474 9.719339 )"
                else if (TokenMatch(sz,"weight",6)) {
                    AI_MD5_SKIP_SPACES();
                    const unsigned int idx = strtoul10(sz,&sz);
                    AI_MD5_SKIP_SPACES();
                    if (idx >= desc.mWeights.size())
                        desc.mWeights.resize(idx+1);

                    WeightDesc& weight = desc.mWeights[idx];
                    weight.mBone = strtoul10(sz,&sz);
                    AI_MD5_SKIP_SPACES();
                    sz = fast_atoreal_move<float>(sz,weight.mWeight);
                    AI_MD5_READ_TRIPLE(weight.vOffsetPosition);
                }
            }
        }
    }
    ASSIMP_LOG_DEBUG("MD5MeshParser end");
}